

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool MeCab::FeatureIndex::convert(Param *param,char *txtfile,string *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  size_t sVar6;
  double dVar7;
  size_t i;
  ulong uVar8;
  size_t i_1;
  long lVar9;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_> dic;
  scoped_fixed_array<char,_8192> buf;
  double alpha;
  double local_300;
  string from;
  Iconv iconv;
  string to;
  string feature;
  char *column [4];
  uint size;
  string model_charset;
  ifstream ifs;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&ifs,txtfile,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x21d);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"ifs");
    poVar4 = std::operator<<(poVar4,"] ");
    poVar4 = std::operator<<(poVar4,"no such file or directory: ");
    std::operator<<(poVar4,txtfile);
    die::~die((die *)column);
  }
  buf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016bb18;
  buf.ptr_ = (char *)operator_new__(0x2000);
  buf.size_ = 0x2000;
  dic.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dic.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dic.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  model_charset._M_dataplus._M_p = (pointer)&model_charset.field_2;
  model_charset._M_string_length = 0;
  model_charset.field_2._M_local_buf[0] = '\0';
  while ((plVar5 = (long *)std::istream::getline((char *)&ifs,(long)buf.ptr_),
         (*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0 &&
         (*buf.ptr_ != '\0'))) {
    sVar6 = tokenize2<char**>(buf.ptr_,":",column,2);
    if (sVar6 != 2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x227);
      poVar4 = std::operator<<(poVar4,") [");
      poVar4 = std::operator<<(poVar4,"tokenize2(buf.get(), \":\", column, 2) == 2");
      poVar4 = std::operator<<(poVar4,"] ");
      poVar4 = std::operator<<(poVar4,"format error: ");
      std::operator<<(poVar4,buf.ptr_);
      die::~die((die *)&from);
    }
    std::__cxx11::string::string((string *)&from,column[0],(allocator *)&to);
    bVar1 = std::operator==(&from,"charset");
    std::__cxx11::string::~string((string *)&from);
    if (bVar1) {
      std::__cxx11::string::assign((char *)&model_charset);
    }
  }
  Param::get<std::__cxx11::string>(&from,param,"dictionary-charset");
  Param::get<std::__cxx11::string>(&to,param,"charset");
  if (from._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&from);
  }
  else {
    iVar2 = decode_charset(model_charset._M_dataplus._M_p);
    iVar3 = decode_charset(from._M_dataplus._M_p);
    if (iVar2 != iVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x233);
      poVar4 = std::operator<<(poVar4,") [");
      poVar4 = std::operator<<(poVar4,
                               "decode_charset(model_charset.c_str()) == decode_charset(from.c_str())"
                              );
      poVar4 = std::operator<<(poVar4,"] ");
      poVar4 = std::operator<<(poVar4,"dictionary charset and model charset are different. ");
      poVar4 = std::operator<<(poVar4,"dictionary_charset=");
      poVar4 = std::operator<<(poVar4,(string *)&from);
      poVar4 = std::operator<<(poVar4," model_charset=");
      std::operator<<(poVar4,(string *)&model_charset);
      die::~die((die *)&feature);
    }
  }
  if (to._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&to);
  }
  Iconv::Iconv(&iconv);
  iVar2 = Iconv::open(&iconv,from._M_dataplus._M_p,(int)to._M_dataplus._M_p);
  if ((char)iVar2 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x240);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"iconv.open(from.c_str(), to.c_str())");
    poVar4 = std::operator<<(poVar4,"] ");
    poVar4 = std::operator<<(poVar4,"cannot create model from=");
    poVar4 = std::operator<<(poVar4,(string *)&from);
    poVar4 = std::operator<<(poVar4," to=");
    std::operator<<(poVar4,(string *)&to);
    die::~die((die *)&feature);
  }
  while (plVar5 = (long *)std::istream::getline((char *)&ifs,(long)buf.ptr_),
        (*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
    sVar6 = tokenize2<char**>(buf.ptr_,"\t",column,2);
    if (sVar6 != 2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x245);
      poVar4 = std::operator<<(poVar4,") [");
      poVar4 = std::operator<<(poVar4,"tokenize2(buf.get(), \"\\t\", column, 2) == 2");
      poVar4 = std::operator<<(poVar4,"] ");
      poVar4 = std::operator<<(poVar4,"format error: ");
      std::operator<<(poVar4,buf.ptr_);
      die::~die((die *)&feature);
    }
    std::__cxx11::string::string((string *)&feature,column[1],(allocator *)&alpha);
    bVar1 = Iconv::convert(&iconv,&feature);
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x248);
      poVar4 = std::operator<<(poVar4,") [");
      poVar4 = std::operator<<(poVar4,"iconv.convert(&feature)");
      std::operator<<(poVar4,"] ");
      die::~die((die *)&alpha);
    }
    dVar7 = (double)fingerprint(&feature);
    local_300 = atof(column[0]);
    alpha = dVar7;
    std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
    emplace_back<std::pair<unsigned_long,double>>
              ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                *)&dic,(pair<unsigned_long,_double> *)&alpha);
    std::__cxx11::string::~string((string *)&feature);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  size = (uint)((ulong)((long)dic.
                              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)dic.
                             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::__cxx11::string::append((char *)output,(ulong)&size);
  feature.field_2._M_allocated_capacity = 0;
  feature.field_2._8_8_ = 0;
  strncpy((char *)&feature,to._M_dataplus._M_p,0x1f);
  std::__cxx11::string::append((char *)output,(ulong)&feature);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (dic.
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             dic.
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  lVar9 = 8;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)dic.
                            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)dic.
                            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar8 = uVar8 + 1) {
    alpha = *(double *)
             ((long)&(dic.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first + lVar9);
    std::__cxx11::string::append((char *)output,(ulong)&alpha);
    lVar9 = lVar9 + 0x10;
  }
  lVar9 = 0;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)dic.
                            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)dic.
                            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar8 = uVar8 + 1) {
    alpha = *(double *)
             ((long)&(dic.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first + lVar9);
    std::__cxx11::string::append((char *)output,(ulong)&alpha);
    lVar9 = lVar9 + 0x10;
  }
  Iconv::~Iconv(&iconv);
  std::__cxx11::string::~string((string *)&to);
  std::__cxx11::string::~string((string *)&from);
  std::__cxx11::string::~string((string *)&model_charset);
  std::
  _Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::~_Vector_base(&dic.
                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 );
  scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf);
  std::ifstream::~ifstream(&ifs);
  return true;
}

Assistant:

bool FeatureIndex::convert(const Param &param,
                           const char* txtfile, std::string *output) {
  std::ifstream ifs(WPATH(txtfile));
  CHECK_DIE(ifs) << "no such file or directory: " << txtfile;
  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[4];
  std::vector<std::pair<uint64_t, double> > dic;
  std::string model_charset;

  while (ifs.getline(buf.get(), buf.size())) {
    if (std::strlen(buf.get()) == 0) {
      break;
    }
    CHECK_DIE(tokenize2(buf.get(), ":", column, 2) == 2)
        << "format error: " << buf.get();
    if (std::string(column[0]) == "charset") {
      model_charset = column[1] + 1;
    }
  }

  std::string from = param.get<std::string>("dictionary-charset");
  std::string to = param.get<std::string>("charset");

  if (!from.empty()) {
    CHECK_DIE(decode_charset(model_charset.c_str())
              == decode_charset(from.c_str()))
        << "dictionary charset and model charset are different. "
        << "dictionary_charset=" << from
        << " model_charset=" << model_charset;
  } else {
    from = model_charset;
  }

  if (to.empty()) {
    to = from;
  }

  Iconv iconv;
  CHECK_DIE(iconv.open(from.c_str(), to.c_str()))
            << "cannot create model from=" << from
            << " to=" << to;

  while (ifs.getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t", column, 2) == 2)
        << "format error: " << buf.get();
    std::string feature = column[1];
    CHECK_DIE(iconv.convert(&feature));
    const uint64_t fp = fingerprint(feature);
    const double alpha = atof(column[0]);
    dic.push_back(std::pair<uint64_t, double>(fp, alpha));
  }

  output->clear();
  unsigned int size = static_cast<unsigned int>(dic.size());
  output->append(reinterpret_cast<const char*>(&size), sizeof(size));

  char charset_buf[32];
  std::fill(charset_buf, charset_buf + sizeof(charset_buf), '\0');
  std::strncpy(charset_buf, to.c_str(), 31);
  output->append(reinterpret_cast<const char *>(charset_buf),
                 sizeof(charset_buf));

  std::sort(dic.begin(), dic.end());

  for (size_t i = 0; i < dic.size(); ++i) {
    const double alpha = dic[i].second;
    output->append(reinterpret_cast<const char *>(&alpha), sizeof(alpha));
  }

  for (size_t i = 0; i < dic.size(); ++i) {
    const uint64_t fp = dic[i].first;
    output->append(reinterpret_cast<const char *>(&fp), sizeof(fp));
  }

  return true;
}